

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void __thiscall FBaseCVar::SetGenericRep(FBaseCVar *this,UCVarValue value,ECVarType type)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = this->Flags;
  if (((uVar1 & 8) == 0) || (!m_DoNoSet)) {
    if (((uVar1 & 0x10) == 0) || ((gamestate == GS_FULLCONSOLE || (gamestate == GS_STARTUP)))) {
      if ((((byte)uVar1 >> 2 & gamestate != GS_STARTUP) != 1) || (demoplayback)) {
        ForceSet(this,value,type,false);
        return;
      }
      if (!netgame) {
        sVar2 = strlen(this->Name);
        Net_WriteByte('\t');
        Net_WriteByte((byte)(type << 6) | (byte)sVar2);
        Net_WriteBytes((BYTE *)this->Name,(int)sVar2);
        switch(type) {
        case CVAR_Bool:
          Net_WriteByte(value.Bool & 1);
          return;
        case CVAR_Int:
          Net_WriteLong(value.Int);
          return;
        case CVAR_Float:
          Net_WriteFloat((float)value.Int);
          return;
        case CVAR_String:
          Net_WriteString(value.String);
          return;
        default:
          return;
        }
      }
      if ((&DAT_009ba5b1)[(long)consoleplayer * 0x2a0] == '\0') {
        Printf("Only setting controllers can change %s\n",this->Name);
        return;
      }
      D_SendServerInfoChange(this,value,type);
      return;
    }
    if (type == CVAR_String) {
      copystring(value.String);
    }
    TArray<FLatchedValue,_FLatchedValue>::Push
              (&LatchedValues,(FLatchedValue *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void FBaseCVar::SetGenericRep (UCVarValue value, ECVarType type)
{
	if ((Flags & CVAR_NOSET) && m_DoNoSet)
	{
		return;
	}
	else if ((Flags & CVAR_LATCH) && gamestate != GS_FULLCONSOLE && gamestate != GS_STARTUP)
	{
		FLatchedValue latch;

		latch.Variable = this;
		latch.Type = type;
		if (type != CVAR_String)
			latch.Value = value;
		else
			latch.Value.String = copystring(value.String);
		LatchedValues.Push (latch);
	}
	else if ((Flags & CVAR_SERVERINFO) && gamestate != GS_STARTUP && !demoplayback)
	{
		if (netgame && !players[consoleplayer].settings_controller)
		{
			Printf ("Only setting controllers can change %s\n", Name);
			return;
		}
		D_SendServerInfoChange (this, value, type);
	}
	else
	{
		ForceSet (value, type);
	}
}